

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PortConnectionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == EmptyPortConnection) || (kind == NamedPortConnection)) ||
      (kind == OrderedPortConnection)) || (kind == WildcardPortConnection)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool PortConnectionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyPortConnection:
        case SyntaxKind::NamedPortConnection:
        case SyntaxKind::OrderedPortConnection:
        case SyntaxKind::WildcardPortConnection:
            return true;
        default:
            return false;
    }
}